

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::TagImport::TagImport(TagImport *this,string_view name)

{
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name._M_dataplus._M_p =
       (pointer)&(this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name._M_string_length = 0;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2._M_local_buf[0]
       = '\0';
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name._M_dataplus._M_p =
       (pointer)&(this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.field_2;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name._M_string_length = 0;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.field_2._M_local_buf[0] =
       '\0';
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.kind_ = Last;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__TagImport_00242e58;
  (this->tag).name._M_dataplus._M_p = (pointer)&(this->tag).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->tag,name._M_str,name._M_str + name._M_len);
  (this->tag).decl.has_func_type = false;
  Var::Var(&(this->tag).decl.type_var);
  *(pointer *)
   ((long)&(this->tag).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->tag).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->tag).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->tag).decl.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tag).decl.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->tag).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  return;
}

Assistant:

explicit TagImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Tag>(), tag(name) {}